

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * slang::ast::builtins::PlaTask::badRange(ASTContext *context,Expression *arg)

{
  Diagnostic *diag;
  Type *arg_00;
  Compilation *pCVar1;
  
  diag = ASTContext::addDiag(context,(DiagCode)0x1c000b,arg->sourceRange);
  arg_00 = not_null<const_slang::ast::Type_*>::get(&arg->type);
  ast::operator<<(diag,arg_00);
  pCVar1 = ASTContext::getCompilation(context);
  return pCVar1->errorType;
}

Assistant:

static const Type& badRange(const ASTContext& context, const Expression& arg) {
        context.addDiag(diag::PlaRangeInAscendingOrder, arg.sourceRange) << *arg.type;
        return context.getCompilation().getErrorType();
    }